

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_command_context.cpp
# Opt level: O3

bool __thiscall
jessibot::io::console_command_context::privateReply
          (console_command_context *this,formatted_message *in_message)

{
  long *plVar1;
  wostream *pwVar2;
  undefined8 uVar3;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *in_string;
  u8string result;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  u8string local_28;
  
  jessilib::io::process_message<jessilib::io::ansi::text_wrapper>(&local_28,in_message);
  jessilib::string_cast<wchar_t,std::__cxx11::u8string>(&local_48,(jessilib *)&local_28,in_string);
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)&std::wcout,local_48._M_dataplus._M_p,local_48._M_string_length);
  plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  uVar3 = std::__throw_bad_cast();
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

bool console_command_context::privateReply(const jessilib::io::formatted_message& in_message) {
	auto result = jessilib::io::process_message<jessilib::io::ansi::text_wrapper>(in_message);
	// TODO check locale before printing to see if console is using UTF-8; if so we can just chuck this straight to cout
	// instead of leveraging to wchar_t
	std::wcout << jessilib::string_cast<wchar_t>(result) << std::endl;
	return true;
}